

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::ProcessGetCFCheckPt
          (PeerManagerImpl *this,CNode *node,Peer *peer,DataStream *vRecv)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  CBlockIndex *block_index_00;
  CBlockIndex *pCVar6;
  Peer *in_RDX;
  uint256 *in_RSI;
  uint256 *in_RDI;
  long in_FS_OFFSET;
  int height;
  int i;
  CBlockIndex *block_index;
  BlockFilterType filter_type;
  vector<uint256,_std::allocator<uint256>_> headers;
  BlockFilterIndex *filter_index;
  CBlockIndex *stop_index;
  uint8_t filter_type_ser;
  uint256 stop_hash;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffdfc;
  uint256 *in_stack_fffffffffffffe00;
  base_blob<256U> *this_00;
  DataStream *in_stack_fffffffffffffe08;
  CBlockIndex *this_01;
  char *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  CBlockIndex *in_stack_fffffffffffffe20;
  vector<uint256,_std::allocator<uint256>_> *in_stack_fffffffffffffe28;
  vector<uint256,_std::allocator<uint256>_> *args_2;
  allocator<char> *__a;
  string *in_stack_fffffffffffffe40;
  CNode *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  uint256 *puVar8;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  PeerManagerImpl *in_stack_fffffffffffffea8;
  char *fmt;
  int iVar9;
  CBlockIndex *pCVar10;
  string_view in_stack_fffffffffffffec0;
  allocator<char> local_101 [65];
  uint256 *local_c0;
  undefined1 local_b8 [76];
  uint32_t in_stack_ffffffffffffff94;
  Level in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffe0;
  CBlockIndex **in_stack_ffffffffffffffe8;
  BlockFilterIndex **in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  DataStream::operator>>(in_stack_fffffffffffffe08,(uchar *)in_stack_fffffffffffffe00);
  DataStream::operator>>(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  uVar7 = CONCAT13(local_b8[0xf],(int3)in_stack_fffffffffffffea0);
  puVar8 = in_RSI;
  uVar3 = std::numeric_limits<unsigned_int>::max();
  this_00 = (base_blob<256U> *)local_b8;
  this_01 = (CBlockIndex *)&local_c0;
  bVar2 = PrepareBlockFilterRequest
                    (in_stack_fffffffffffffea8,(CNode *)CONCAT44(in_stack_fffffffffffffea4,uVar7),
                     in_RDX,(BlockFilterType)((ulong)puVar8 >> 0x38),in_stack_ffffffffffffff94,
                     in_RDI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,
                     in_stack_fffffffffffffff0);
  if (bVar2) {
    std::allocator<uint256>::allocator
              ((allocator<uint256> *)CONCAT44(in_stack_fffffffffffffdfc,uVar3));
    std::vector<uint256,_std::allocator<uint256>_>::vector
              (in_stack_fffffffffffffe28,(size_type)in_stack_fffffffffffffe20,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    std::allocator<uint256>::~allocator
              ((allocator<uint256> *)CONCAT44(in_stack_fffffffffffffdfc,uVar3));
    sVar5 = std::vector<uint256,_std::allocator<uint256>_>::size
                      ((vector<uint256,_std::allocator<uint256>_> *)
                       CONCAT44(in_stack_fffffffffffffdfc,uVar3));
    iVar9 = (int)sVar5;
    do {
      iVar9 = iVar9 + -1;
      if (iVar9 < 0) {
        __a = local_101;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,__a);
        args_2 = (vector<uint256,_std::allocator<uint256>_> *)(local_b8 + 0x10);
        CBlockIndex::GetBlockHash(this_01);
        ::(anonymous_namespace)::PeerManagerImpl::
        MakeAndPushMessage<unsigned_char&,uint256,std::vector<uint256,std::allocator<uint256>>&>
                  ((PeerManagerImpl *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                   in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,(uchar *)__a,in_RSI,args_2);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdfc,uVar3));
        std::allocator<char>::~allocator(local_101);
        goto LAB_01092b5e;
      }
      iVar4 = iVar9 * 1000 + 1000;
      block_index_00 = CBlockIndex::GetAncestor(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c)
      ;
      puVar8 = local_c0;
      pCVar10 = block_index_00;
      std::vector<uint256,_std::allocator<uint256>_>::operator[]
                ((vector<uint256,_std::allocator<uint256>_> *)this_01,(size_type)this_00);
      bVar2 = BlockFilterIndex::LookupFilterHeader
                        ((BlockFilterIndex *)
                         CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                         block_index_00,puVar8);
      in_stack_fffffffffffffe6c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe6c);
    } while (bVar2);
    bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffdfc,uVar3),Trace);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                 in_stack_fffffffffffffe10);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                 in_stack_fffffffffffffe10);
      fmt = "Failed to find block filter header in index: filter_type=%s, block_hash=%s\n";
      pCVar6 = (CBlockIndex *)
               BlockFilterTypeName_abi_cxx11_
                         ((BlockFilterType)((uint)in_stack_fffffffffffffe1c >> 0x18));
      CBlockIndex::GetBlockHash(this_01);
      this_01 = pCVar6;
      base_blob<256u>::ToString_abi_cxx11_(this_00);
      uVar7 = 1;
      source_file._M_len._4_4_ = iVar9;
      source_file._M_len._0_4_ = iVar4;
      source_file._M_str = (char *)pCVar10;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                (in_stack_fffffffffffffec0,source_file,in_stack_fffffffffffffe6c,
                 (LogFlags)block_index_00,in_stack_ffffffffffffffa0,(ConstevalFormatString<2U>)fmt,
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdfc,uVar7));
    }
LAB_01092b5e:
    std::vector<uint256,_std::allocator<uint256>_>::~vector
              ((vector<uint256,_std::allocator<uint256>_> *)this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessGetCFCheckPt(CNode& node, Peer& peer, DataStream& vRecv)
{
    uint8_t filter_type_ser;
    uint256 stop_hash;

    vRecv >> filter_type_ser >> stop_hash;

    const BlockFilterType filter_type = static_cast<BlockFilterType>(filter_type_ser);

    const CBlockIndex* stop_index;
    BlockFilterIndex* filter_index;
    if (!PrepareBlockFilterRequest(node, peer, filter_type, /*start_height=*/0, stop_hash,
                                   /*max_height_diff=*/std::numeric_limits<uint32_t>::max(),
                                   stop_index, filter_index)) {
        return;
    }

    std::vector<uint256> headers(stop_index->nHeight / CFCHECKPT_INTERVAL);

    // Populate headers.
    const CBlockIndex* block_index = stop_index;
    for (int i = headers.size() - 1; i >= 0; i--) {
        int height = (i + 1) * CFCHECKPT_INTERVAL;
        block_index = block_index->GetAncestor(height);

        if (!filter_index->LookupFilterHeader(block_index, headers[i])) {
            LogDebug(BCLog::NET, "Failed to find block filter header in index: filter_type=%s, block_hash=%s\n",
                         BlockFilterTypeName(filter_type), block_index->GetBlockHash().ToString());
            return;
        }
    }

    MakeAndPushMessage(node, NetMsgType::CFCHECKPT,
              filter_type_ser,
              stop_index->GetBlockHash(),
              headers);
}